

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR cast_string_recursive
                 (lyd_node *node,lyxp_set *set,uint32_t indent,char **str,uint32_t *used,
                 uint32_t *size)

{
  int iVar1;
  lysc_node *plVar2;
  long lVar3;
  ly_ctx *plVar4;
  uint uVar5;
  uint32_t *size_00;
  LY_ERR LVar6;
  uint32_t uVar7;
  lyd_node *__s;
  size_t sVar8;
  char *pcVar9;
  ushort uVar10;
  LY_ERR unaff_EBP;
  LY_ERR ret__;
  bool bVar11;
  char *buf;
  ly_out *out;
  lyxp_node_type child_type;
  char *ptr;
  lyd_node *local_60;
  uint32_t *local_58;
  ly_out *local_50;
  undefined8 local_48;
  char *local_40;
  long local_38;
  
  local_40 = (char *)0x0;
  if ((((node != (lyd_node *)0x0) && (set->root_type == LYXP_NODE_ROOT_CONFIG)) &&
      (node->schema != (lysc_node *)0x0)) &&
     (unaff_EBP = LY_SUCCESS, (node->schema->flags & 2) != 0)) {
    return LY_SUCCESS;
  }
  local_58 = size;
  if (node == (lyd_node *)0x0) {
    LVar6 = cast_string_realloc(set->ctx,1,str,used,size);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    pcVar9 = *str;
    uVar7 = *used;
    (pcVar9 + (uVar7 - 1))[0] = '\n';
    (pcVar9 + (uVar7 - 1))[1] = '\0';
    *used = *used + 1;
    local_60 = (lyd_node *)0x0;
    local_48._0_4_ = LYXP_NODE_NONE;
    while (LVar6 = moveto_axis_node_next
                             (&local_60,(lyxp_node_type *)&local_48,(lyd_node *)0x0,set->root_type,
                              LYXP_AXIS_CHILD,set), LVar6 == LY_SUCCESS) {
      LVar6 = cast_string_recursive(local_60,set,indent + 1,str,used,local_58);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
    }
    LVar6 = cast_string_realloc(set->ctx,1,str,used,local_58);
    if (LVar6 == LY_SUCCESS) {
      pcVar9 = *str;
      uVar7 = *used;
      (pcVar9 + (uVar7 - 1))[0] = '\n';
      (pcVar9 + (uVar7 - 1))[1] = '\0';
      *used = *used + 1;
      return LY_SUCCESS;
    }
    return LVar6;
  }
  plVar2 = node->schema;
  if (plVar2 == (lysc_node *)0x0) {
    lVar3._0_4_ = node[1].hash;
    lVar3._4_4_ = node[1].flags;
    uVar10 = (ushort)(lVar3 == 0) * 3 + 1;
  }
  else {
    uVar10 = plVar2->nodetype;
  }
  if (0x1f < uVar10) {
    if (uVar10 < 0x100) {
      if ((uVar10 == 0x20) || (uVar10 == 0x60)) {
        if (*(char **)(node + 1) == (char *)0x0) {
          local_60 = (lyd_node *)strdup("");
          if (local_60 == (lyd_node *)0x0) {
            ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "cast_string_recursive");
            return LY_EMEM;
          }
        }
        else {
          if ((*(int *)&node[1].schema == 4) &&
             (LVar6 = lyd_parse_data_mem(set->ctx,*(char **)(node + 1),LYD_LYB,0x30000,0,
                                         (lyd_node **)&local_48), LVar6 == LY_SUCCESS)) {
            free(*(void **)(node + 1));
            node[1].hash = (lyxp_node_type)local_48;
            node[1].flags = local_48._4_4_;
            *(undefined4 *)&node[1].schema = 0;
          }
          iVar1 = *(int *)&node[1].schema;
          bVar11 = true;
          if (iVar1 - 1U < 3) {
            local_60 = (lyd_node *)strdup(*(char **)(node + 1));
            if (local_60 == (lyd_node *)0x0) {
              bVar11 = false;
              ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "cast_string_recursive");
              unaff_EBP = LY_EMEM;
            }
          }
          else if (iVar1 == 0) {
            bVar11 = false;
            unaff_EBP = ly_out_new_memory((char **)&local_60,0,&local_50);
            if (unaff_EBP == LY_SUCCESS) {
              LVar6 = lyd_print_all(local_50,*(lyd_node **)(node + 1),LYD_XML,0);
              ly_out_free(local_50,(_func_void_void_ptr *)0x0,'\0');
              bVar11 = LVar6 == LY_SUCCESS;
              if (!bVar11) {
                unaff_EBP = LVar6;
              }
            }
          }
          else if (iVar1 == 4) {
            bVar11 = false;
            ly_log(set->ctx,LY_LLERR,LY_EINVAL,"Cannot convert LYB anydata into string.");
            unaff_EBP = LY_EINVAL;
          }
          if (!bVar11) {
            return unaff_EBP;
          }
        }
        pcVar9 = strtok_r((char *)local_60,"\n",&local_40);
        uVar5 = indent * 2;
        local_38 = (ulong)uVar5 + 1;
        do {
          plVar4 = set->ctx;
          sVar8 = strlen(pcVar9);
          LVar6 = cast_string_realloc(plVar4,sVar8 + local_38,str,used,local_58);
          if (LVar6 != LY_SUCCESS) {
            free(local_60);
            return LVar6;
          }
          memset(*str + (*used - 1),0x20,(ulong)uVar5);
          uVar7 = *used;
          *used = uVar7 + uVar5;
          strcpy(*str + ((uVar7 + uVar5) - 1),pcVar9);
          sVar8 = strlen(pcVar9);
          uVar7 = *used;
          *used = uVar7 + (int)sVar8;
          pcVar9 = *str;
          (pcVar9 + (((int)sVar8 + uVar7) - 1))[0] = '\n';
          (pcVar9 + (((int)sVar8 + uVar7) - 1))[1] = '\0';
          *used = *used + 1;
          pcVar9 = strtok_r((char *)0x0,"\n",&local_40);
        } while (pcVar9 != (char *)0x0);
        free(local_60);
        return LY_SUCCESS;
      }
    }
    else if ((uVar10 == 0x400) || (uVar10 == 0x100)) goto LAB_001b87b7;
LAB_001b887b:
    ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x259);
    return LY_EINT;
  }
  if (uVar10 < 8) {
    if (uVar10 != 1) {
      if (uVar10 != 4) goto LAB_001b887b;
LAB_001b880b:
      if (plVar2 == (lysc_node *)0x0) {
        __s = node[1].prev;
      }
      else if ((plVar2->nodetype & 0xc) == 0) {
        __s = (lyd_node *)0x0;
      }
      else {
        __s = *(lyd_node **)(node + 1);
        if (__s == (lyd_node *)0x0) {
          __s = (lyd_node *)lyd_value_get_canonical(plVar2->module->ctx,(lyd_value *)(node + 1));
        }
      }
      plVar4 = set->ctx;
      uVar5 = indent * 2;
      sVar8 = strlen((char *)__s);
      LVar6 = cast_string_realloc(plVar4,sVar8 + uVar5 + 1,str,used,local_58);
      if (LVar6 == LY_SUCCESS) {
        memset(*str + (*used - 1),0x20,(ulong)uVar5);
        uVar7 = *used + uVar5;
        *used = uVar7;
        if (uVar7 == 1) {
          strcpy(*str,(char *)__s);
          sVar8 = strlen((char *)__s);
          *used = *used + (int)sVar8;
          return LY_SUCCESS;
        }
        sprintf(*str + (uVar7 - 1),"%s\n",__s);
        sVar8 = strlen((char *)__s);
        *used = (int)sVar8 + *used + 1;
        return LY_SUCCESS;
      }
      return LVar6;
    }
  }
  else {
    if (uVar10 == 8) goto LAB_001b880b;
    if (uVar10 != 0x10) goto LAB_001b887b;
  }
LAB_001b87b7:
  LVar6 = cast_string_realloc(set->ctx,1,str,used,size);
  size_00 = local_58;
  if (LVar6 != LY_SUCCESS) {
    return LVar6;
  }
  pcVar9 = *str;
  uVar7 = *used;
  (pcVar9 + (uVar7 - 1))[0] = '\n';
  (pcVar9 + (uVar7 - 1))[1] = '\0';
  *used = *used + 1;
  if ((node->schema == (lysc_node *)0x0) || ((node->schema->nodetype & 0x711) != 0)) {
    local_60 = *(lyd_node **)(node + 1);
  }
  else {
    local_60 = (lyd_node *)0x0;
  }
  if (local_60 != (lyd_node *)0x0) {
    do {
      LVar6 = cast_string_recursive(local_60,set,indent + 1,str,used,size_00);
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      local_60 = local_60->next;
    } while (local_60 != (lyd_node *)0x0);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
cast_string_recursive(const struct lyd_node *node, struct lyxp_set *set, uint32_t indent, char **str, uint32_t *used,
        uint32_t *size)
{
    char *buf, *line, *ptr = NULL;
    const char *value_str;
    uint16_t nodetype;
    const struct lyd_node *child;
    enum lyxp_node_type child_type;
    struct lyd_node *tree;
    struct lyd_node_any *any;
    LY_ERR rc;

    if ((set->root_type == LYXP_NODE_ROOT_CONFIG) && node && node->schema && (node->schema->flags & LYS_CONFIG_R)) {
        return LY_SUCCESS;
    }

    if (!node) {
        /* fake container */
        LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
        strcpy(*str + (*used - 1), "\n");
        ++(*used);

        ++indent;

        /* print all the top-level nodes */
        child = NULL;
        child_type = 0;
        while (!moveto_axis_node_next(&child, &child_type, NULL, set->root_type, LYXP_AXIS_CHILD, set)) {
            LY_CHECK_RET(cast_string_recursive(child, set, indent, str, used, size));
        }

        /* end fake container */
        LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
        strcpy(*str + (*used - 1), "\n");
        ++(*used);

        --indent;
    } else {
        if (node->schema) {
            nodetype = node->schema->nodetype;
        } else if (lyd_child(node)) {
            nodetype = LYS_CONTAINER;
        } else {
            nodetype = LYS_LEAF;
        }

        switch (nodetype) {
        case LYS_CONTAINER:
        case LYS_LIST:
        case LYS_RPC:
        case LYS_NOTIF:
            LY_CHECK_RET(cast_string_realloc(set->ctx, 1, str, used, size));
            strcpy(*str + (*used - 1), "\n");
            ++(*used);

            for (child = lyd_child(node); child; child = child->next) {
                LY_CHECK_RET(cast_string_recursive(child, set, indent + 1, str, used, size));
            }

            break;

        case LYS_LEAF:
        case LYS_LEAFLIST:
            value_str = lyd_get_value(node);

            /* print indent */
            LY_CHECK_RET(cast_string_realloc(set->ctx, indent * 2 + strlen(value_str) + 1, str, used, size));
            memset(*str + (*used - 1), ' ', indent * 2);
            *used += indent * 2;

            /* print value */
            if (*used == 1) {
                sprintf(*str + (*used - 1), "%s", value_str);
                *used += strlen(value_str);
            } else {
                sprintf(*str + (*used - 1), "%s\n", value_str);
                *used += strlen(value_str) + 1;
            }

            break;

        case LYS_ANYXML:
        case LYS_ANYDATA:
            any = (struct lyd_node_any *)node;
            if (!(void *)any->value.tree) {
                /* no content */
                buf = strdup("");
                LY_CHECK_ERR_RET(!buf, LOGMEM(set->ctx), LY_EMEM);
            } else {
                struct ly_out *out;

                if (any->value_type == LYD_ANYDATA_LYB) {
                    /* try to parse it into a data tree */
                    if (lyd_parse_data_mem((struct ly_ctx *)set->ctx, any->value.mem, LYD_LYB,
                            LYD_PARSE_ONLY | LYD_PARSE_STRICT, 0, &tree) == LY_SUCCESS) {
                        /* successfully parsed */
                        free(any->value.mem);
                        any->value.tree = tree;
                        any->value_type = LYD_ANYDATA_DATATREE;
                    }
                    /* error is covered by the following switch where LYD_ANYDATA_LYB causes failure */
                }

                switch (any->value_type) {
                case LYD_ANYDATA_STRING:
                case LYD_ANYDATA_XML:
                case LYD_ANYDATA_JSON:
                    buf = strdup(any->value.json);
                    LY_CHECK_ERR_RET(!buf, LOGMEM(set->ctx), LY_EMEM);
                    break;
                case LYD_ANYDATA_DATATREE:
                    LY_CHECK_RET(ly_out_new_memory(&buf, 0, &out));
                    rc = lyd_print_all(out, any->value.tree, LYD_XML, 0);
                    ly_out_free(out, NULL, 0);
                    LY_CHECK_RET(rc);
                    break;
                case LYD_ANYDATA_LYB:
                    LOGERR(set->ctx, LY_EINVAL, "Cannot convert LYB anydata into string.");
                    return LY_EINVAL;
                }
            }

            line = strtok_r(buf, "\n", &ptr);
            do {
                rc = cast_string_realloc(set->ctx, indent * 2 + strlen(line) + 1, str, used, size);
                if (rc != LY_SUCCESS) {
                    free(buf);
                    return rc;
                }
                memset(*str + (*used - 1), ' ', indent * 2);
                *used += indent * 2;

                strcpy(*str + (*used - 1), line);
                *used += strlen(line);

                strcpy(*str + (*used - 1), "\n");
                *used += 1;
            } while ((line = strtok_r(NULL, "\n", &ptr)));

            free(buf);
            break;

        default:
            LOGINT_RET(set->ctx);
        }
    }

    return LY_SUCCESS;
}